

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

PVG_FT_Fixed PVG_FT_Vector_Length(PVG_FT_Vector *vec)

{
  byte bVar1;
  PVG_FT_Fixed PVar2;
  PVG_FT_Vector *local_40;
  PVG_FT_Vector *local_38;
  undefined1 local_30 [8];
  PVG_FT_Vector v;
  PVG_FT_Int shift;
  PVG_FT_Vector *vec_local;
  
  local_40 = (PVG_FT_Vector *)vec->x;
  local_38 = (PVG_FT_Vector *)vec->y;
  if (local_40 == (PVG_FT_Vector *)0x0) {
    if ((long)local_38 < 0) {
      local_38 = (PVG_FT_Vector *)-(long)local_38;
    }
    vec_local = local_38;
  }
  else if (local_38 == (PVG_FT_Vector *)0x0) {
    if ((long)local_40 < 0) {
      local_40 = (PVG_FT_Vector *)-(long)local_40;
    }
    vec_local = local_40;
  }
  else {
    local_30 = (undefined1  [8])local_40;
    v.x = (PVG_FT_Pos)local_38;
    v.y._4_4_ = ft_trig_prenorm((PVG_FT_Vector *)local_30);
    ft_trig_pseudo_polarize((PVG_FT_Vector *)local_30);
    PVar2 = ft_trig_downscale((PVG_FT_Fixed)local_30);
    bVar1 = (byte)v.y._4_4_;
    if (v.y._4_4_ < 1) {
      vec_local = (PVG_FT_Vector *)(ulong)(uint)((int)PVar2 << (-bVar1 & 0x1f));
    }
    else {
      vec_local = (PVG_FT_Vector *)(PVar2 + (1 << (bVar1 - 1 & 0x1f)) >> (bVar1 & 0x3f));
    }
  }
  return (PVG_FT_Fixed)vec_local;
}

Assistant:

PVG_FT_Fixed PVG_FT_Vector_Length(PVG_FT_Vector* vec)
{
    PVG_FT_Int    shift;
    PVG_FT_Vector v;

    v = *vec;

    /* handle trivial cases */
    if (v.x == 0) {
        return PVG_FT_ABS(v.y);
    } else if (v.y == 0) {
        return PVG_FT_ABS(v.x);
    }

    /* general case */
    shift = ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    v.x = ft_trig_downscale(v.x);

    if (shift > 0) return (v.x + (1 << (shift - 1))) >> shift;

    return (PVG_FT_Fixed)((PVG_FT_UInt32)v.x << -shift);
}